

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::FieldDescriptorProto::MergeFrom
          (FieldDescriptorProto *this,FieldDescriptorProto *from)

{
  uint uVar1;
  LogMessage *other;
  string *psVar2;
  FieldOptions *this_00;
  FieldOptions *from_00;
  InternalMetadataWithArena *this_01;
  LogFinisher local_d5;
  uint32 cached_has_bits;
  byte local_c1;
  LogMessage local_c0;
  FieldDescriptorProto *local_88;
  FieldDescriptorProto *from_local;
  FieldDescriptorProto *this_local;
  InternalMetadataWithArena *local_70;
  InternalMetadataWithArena *local_68;
  undefined4 local_3c;
  HasBits<1UL> *local_38;
  InternalMetadataWithArena *local_30;
  Container *local_28;
  InternalMetadataWithArena *local_20;
  InternalMetadataWithArena *local_18;
  InternalMetadataWithArena *local_10;
  
  local_c1 = 0;
  local_88 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_c0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x1358);
    local_c1 = 1;
    other = internal::LogMessage::operator<<(&local_c0,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_d5,other);
  }
  if ((local_c1 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_c0);
  }
  this_01 = &this->_internal_metadata_;
  this_local = (FieldDescriptorProto *)&local_88->_internal_metadata_;
  local_70 = this_01;
  local_68 = (InternalMetadataWithArena *)this_local;
  local_10 = (InternalMetadataWithArena *)this_local;
  if (((uint)(((InternalMetadataWithArena *)this_local)->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    local_30 = (InternalMetadataWithArena *)this_local;
    local_20 = (InternalMetadataWithArena *)this_local;
    local_18 = (InternalMetadataWithArena *)this_local;
    if (((uint)(((InternalMetadataWithArena *)this_local)->
               super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
               ).ptr_ & 1) == 1) {
      local_28 = internal::
                 InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>::Container>
                           ((InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,google::protobuf::internal::InternalMetadataWithArena>
                             *)this_local);
    }
    else {
      local_28 = (Container *)internal::InternalMetadataWithArena::default_instance();
    }
    internal::InternalMetadataWithArena::DoMergeFrom(this_01,&local_28->unknown_fields);
  }
  local_38 = &local_88->_has_bits_;
  local_3c = 0;
  uVar1 = local_38->has_bits_[0];
  if ((uVar1 & 0xff) != 0) {
    if ((uVar1 & 1) != 0) {
      set_has_name(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault(&this->name_,psVar2,(local_88->name_).ptr_);
    }
    if ((uVar1 & 2) != 0) {
      set_has_extendee(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->extendee_,psVar2,(local_88->extendee_).ptr_);
    }
    if ((uVar1 & 4) != 0) {
      set_has_type_name(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->type_name_,psVar2,(local_88->type_name_).ptr_);
    }
    if ((uVar1 & 8) != 0) {
      set_has_default_value(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->default_value_,psVar2,(local_88->default_value_).ptr_);
    }
    if ((uVar1 & 0x10) != 0) {
      set_has_json_name(this);
      psVar2 = internal::GetEmptyStringAlreadyInited_abi_cxx11_();
      internal::ArenaStringPtr::AssignWithDefault
                (&this->json_name_,psVar2,(local_88->json_name_).ptr_);
    }
    if ((uVar1 & 0x20) != 0) {
      this_00 = mutable_options(this);
      from_00 = options(local_88);
      FieldOptions::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 0x40) != 0) {
      this->number_ = local_88->number_;
    }
    if ((uVar1 & 0x80) != 0) {
      this->oneof_index_ = local_88->oneof_index_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  if ((uVar1 & 0x300) != 0) {
    if ((uVar1 & 0x100) != 0) {
      this->label_ = local_88->label_;
    }
    if ((uVar1 & 0x200) != 0) {
      this->type_ = local_88->type_;
    }
    (this->_has_bits_).has_bits_[0] = uVar1 | (this->_has_bits_).has_bits_[0];
  }
  return;
}

Assistant:

void FieldDescriptorProto::MergeFrom(const FieldDescriptorProto& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FieldDescriptorProto)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 255u) {
    if (cached_has_bits & 0x00000001u) {
      set_has_name();
      name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.name_);
    }
    if (cached_has_bits & 0x00000002u) {
      set_has_extendee();
      extendee_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.extendee_);
    }
    if (cached_has_bits & 0x00000004u) {
      set_has_type_name();
      type_name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.type_name_);
    }
    if (cached_has_bits & 0x00000008u) {
      set_has_default_value();
      default_value_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.default_value_);
    }
    if (cached_has_bits & 0x00000010u) {
      set_has_json_name();
      json_name_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.json_name_);
    }
    if (cached_has_bits & 0x00000020u) {
      mutable_options()->::google::protobuf::FieldOptions::MergeFrom(from.options());
    }
    if (cached_has_bits & 0x00000040u) {
      number_ = from.number_;
    }
    if (cached_has_bits & 0x00000080u) {
      oneof_index_ = from.oneof_index_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
  if (cached_has_bits & 768u) {
    if (cached_has_bits & 0x00000100u) {
      label_ = from.label_;
    }
    if (cached_has_bits & 0x00000200u) {
      type_ = from.type_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}